

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

RegOpnd * __thiscall
IRBuilder::BuildDstOpnd
          (IRBuilder *this,RegSlot dstRegSlot,IRType type,bool isCatchObjectSym,bool reuseTemp)

{
  BVFixed *this_00;
  code *pcVar1;
  BOOLEAN BVar2;
  bool bVar3;
  BOOL BVar4;
  RegSlot RVar5;
  SymID SVar6;
  undefined4 *puVar7;
  JITTimeFunctionBody *this_01;
  StackSym *sym;
  RegOpnd *pRVar8;
  
  SVar6 = dstRegSlot;
  if (dstRegSlot < this->firstTemp) {
    BVar4 = RegIsConstant(this,dstRegSlot);
    if (BVar4 == 0) {
      bVar3 = IsLoopBody(this);
      if (bVar3) {
        SetLoopBodyStSlot(this,dstRegSlot,isCatchObjectSym);
        EnsureLoopBodyLoadSlot(this,dstRegSlot,isCatchObjectSym);
      }
    }
    else {
      dstRegSlot = 0xffffffff;
    }
  }
  else {
    bVar3 = IsLoopBody(this);
    if (bVar3) {
      BVar2 = BVFixed::Test(this->m_ldSlots,dstRegSlot);
      if (BVar2 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x537,"(!this->m_ldSlots->Test(dstRegSlot))",
                           "!this->m_ldSlots->Test(dstRegSlot)");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar7 = 0;
      }
      this_00 = this->m_usedAsTemp;
      this_01 = Func::GetJITFunctionBody(this->m_func);
      RVar5 = JITTimeFunctionBody::GetFirstTmpReg(this_01);
      BVFixed::Set(this_00,dstRegSlot - RVar5);
    }
    SVar6 = GetMappedTemp(this,dstRegSlot);
    if (SVar6 == 0) {
      SetMappedTemp(this,dstRegSlot,dstRegSlot);
      SVar6 = dstRegSlot;
    }
    else if (!reuseTemp) {
      SVar6 = SymTable::NewID(this->m_func->m_symTable);
      SetMappedTemp(this,dstRegSlot,SVar6);
    }
  }
  sym = StackSym::FindOrCreate(SVar6,dstRegSlot,this->m_func,TyVar);
  sym->field_0x18 = sym->field_0x18 & 0xfb;
  pRVar8 = IR::RegOpnd::New(sym,type,this->m_func);
  return pRVar8;
}

Assistant:

IR::RegOpnd *
IRBuilder::BuildDstOpnd(Js::RegSlot dstRegSlot, IRType type, bool isCatchObjectSym, bool reuseTemp)
{
    StackSym *   symDst;
    SymID        symID;

    if (this->RegIsTemp(dstRegSlot))
    {
#if DBG
        if (this->IsLoopBody())
        {
            // If we are doing loop body, and a temp reg slot is loaded via LdSlot
            // That means that we have detected that the slot is live coming in to the loop.
            // This would only happen for the value of a "with" statement, so there shouldn't
            // be any def for those
            Assert(!this->m_ldSlots->Test(dstRegSlot));
            this->m_usedAsTemp->Set(dstRegSlot - m_func->GetJITFunctionBody()->GetFirstTmpReg());
        }
#endif

        // This is a def of a temp. Create a new sym ID for it if it's been used since its last def.
        //     !!!NOTE: always process an instruction's temp uses before its temp defs!!!

        symID = this->GetMappedTemp(dstRegSlot);
        if (symID == 0)
        {
            // First time we've seen the temp. Just use the number that the front end gave it.
            symID = static_cast<SymID>(dstRegSlot);
            this->SetMappedTemp(dstRegSlot, symID);
        }
        else if (!reuseTemp)
        {
            // Byte code has not told us to reuse the mapped temp at this def, so don't. Make a new one.
            symID = m_func->m_symTable->NewID();
            this->SetMappedTemp(dstRegSlot, symID);
        }
    }
    else
    {
        symID = static_cast<SymID>(dstRegSlot);
        if (this->RegIsConstant(dstRegSlot))
        {
            // Don't need to track constant registers for bailout. Don't set the byte code register for constant.
            dstRegSlot = Js::Constants::NoRegister;
        }
        else if (IsLoopBody())
        {
            // Loop body and not constants
            this->SetLoopBodyStSlot(symID, isCatchObjectSym);

            // We need to make sure that the symbols is loaded as well
            // so that the sym will be defined on all path.
            this->EnsureLoopBodyLoadSlot(symID, isCatchObjectSym);
        }
    }

    symDst = StackSym::FindOrCreate(symID, dstRegSlot, m_func);

    // Always reset isSafeThis to false.  We'll set it to true for singleDef cases,
    // but want to reset it to false if it is multi-def.
    // NOTE: We could handle the multiDef if they are all safe, but it probably isn't very common.
    symDst->m_isSafeThis = false;

    IR::RegOpnd *regOpnd =  IR::RegOpnd::New(symDst, type, m_func);
    return regOpnd;
}